

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void mark_list(zt_gc_t *gc,value_t *value)

{
  void *in_RSI;
  void *in_RDI;
  list_t *list;
  void *value_00;
  
  value_00 = in_RSI;
  if (*(long *)((long)in_RSI + 0x28) != 0) {
    mark_value((zt_gc_t *)list,in_RDI,in_RSI);
  }
  if (*(long *)((long)in_RSI + 0x20) != 0) {
    mark_value((zt_gc_t *)list,in_RDI,value_00);
  }
  return;
}

Assistant:

static void
mark_list(zt_gc_t * gc, value_t * value) {
    list_t  * list = (list_t *)value;

    /*  we want to mark any child "objects" that are managed
     *  by the GC
     */
    if (list->value) {
        mark_value(gc, NULL, list->value);
    }

    if (list->tail) {
        mark_value(gc, NULL, list->tail);
    }
}